

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtesteventloop.cpp
# Opt level: O2

void QTestEventLoop::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  long lVar2;
  
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  lVar1 = QObject::thread();
  lVar2 = QThread::currentThread();
  if (lVar1 != lVar2) {
    QMetaObject::invokeMethod<>(_o,"exitLoop",QueuedConnection);
    return;
  }
  QBasicTimer::stop();
  if (*(long *)(_o + 0x10) != 0) {
    QEventLoop::exit((int)*(long *)(_o + 0x10));
    return;
  }
  return;
}

Assistant:

void QTestEventLoop::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTestEventLoop *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->exitLoop(); break;
        default: ;
        }
    }
    (void)_a;
}